

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<float>::doRender(RendererImpl<float> *this,float *stereoStream,Bit32u len)

{
  bool bVar1;
  Bit32u BVar2;
  uint uVar3;
  Analog *pAVar4;
  uint local_34;
  uint local_24;
  Bit32u thisPassLen;
  Bit32u len_local;
  float *stereoStream_local;
  RendererImpl<float> *this_local;
  
  bVar1 = Renderer::isActivated(&this->super_Renderer);
  local_24 = len;
  _thisPassLen = stereoStream;
  if (bVar1) {
    for (; local_24 != 0; local_24 = local_24 - local_34) {
      if (local_24 < 0x1001) {
        local_34 = local_24;
      }
      else {
        local_34 = 0x1000;
      }
      pAVar4 = Renderer::getAnalog(&this->super_Renderer);
      BVar2 = (*pAVar4->_vptr_Analog[3])(pAVar4,(ulong)local_34);
      doRenderStreams(this,&this->tmpBuffers,BVar2);
      pAVar4 = Renderer::getAnalog(&this->super_Renderer);
      uVar3 = (*pAVar4->_vptr_Analog[7])
                        (pAVar4,_thisPassLen,this->tmpNonReverbLeft,this->tmpNonReverbRight,
                         this->tmpReverbDryLeft,this->tmpReverbDryRight,this->tmpReverbWetLeft,
                         this->tmpReverbWetRight,local_34);
      if ((uVar3 & 1) == 0) {
        Renderer::printDebug
                  (&this->super_Renderer,"RendererImpl: Invalid call to Analog::process()!\n");
        Synth::muteSampleBuffer(_thisPassLen,local_24 << 1);
        return;
      }
      _thisPassLen = _thisPassLen + (local_34 << 1);
    }
  }
  else {
    pAVar4 = Renderer::getAnalog(&this->super_Renderer);
    BVar2 = (*pAVar4->_vptr_Analog[3])(pAVar4,(ulong)len);
    Renderer::incRenderedSampleCount(&this->super_Renderer,BVar2);
    pAVar4 = Renderer::getAnalog(&this->super_Renderer);
    uVar3 = (*pAVar4->_vptr_Analog[7])(pAVar4,0,0,0,0,0,0,stereoStream,len);
    if ((uVar3 & 1) == 0) {
      Renderer::printDebug
                (&this->super_Renderer,"RendererImpl: Invalid call to Analog::process()!\n");
    }
    Synth::muteSampleBuffer(stereoStream,len << 1);
    Renderer::updateDisplayState(&this->super_Renderer);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRender(Sample *stereoStream, Bit32u len) {
	if (!isActivated()) {
		incRenderedSampleCount(getAnalog().getDACStreamsLength(len));
		if (!getAnalog().process(NULL, NULL, NULL, NULL, NULL, NULL, stereoStream, len)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
		}
		Synth::muteSampleBuffer(stereoStream, len << 1);
		updateDisplayState();
		return;
	}

	while (len > 0) {
		// As in AnalogOutputMode_ACCURATE mode output is upsampled, MAX_SAMPLES_PER_RUN is more than enough for the temp buffers.
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(tmpBuffers, getAnalog().getDACStreamsLength(thisPassLen));
		if (!getAnalog().process(stereoStream, tmpNonReverbLeft, tmpNonReverbRight, tmpReverbDryLeft, tmpReverbDryRight, tmpReverbWetLeft, tmpReverbWetRight, thisPassLen)) {
			printDebug("RendererImpl: Invalid call to Analog::process()!\n");
			Synth::muteSampleBuffer(stereoStream, len << 1);
			return;
		}
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}